

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

BinInputStream * __thiscall xercesc_4_0::XMLURL::makeNewStream(XMLURL *this)

{
  ulong fromIndex;
  XMLCh toXlat;
  XMLCh toXlat_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  BinInputStream *pBVar4;
  XMLCh *toDelete;
  ulong uVar5;
  BinFileInputStream *this_00;
  MalformedURLException *pMVar6;
  long lVar7;
  ulong uVar8;
  XMLCh value1 [4];
  ArrayJanitor<char16_t> basePathName;
  
  if (this->fProtocol != File) {
LAB_0026d1f3:
    if (XMLPlatformUtils::fgNetAccessor != (long *)0x0) {
      pBVar4 = (BinInputStream *)
               (**(code **)(*XMLPlatformUtils::fgNetAccessor + 0x18))
                         (XMLPlatformUtils::fgNetAccessor,this,0);
      return pBVar4;
    }
    pMVar6 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x29f,URL_UnsupportedProto,this->fMemoryManager);
    __cxa_throw(pMVar6,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  if (this->fHost != (XMLCh *)0x0) {
    iVar1 = XMLString::compareIStringASCII(this->fHost,(XMLCh *)XMLUni::fgLocalHostString);
    if (iVar1 != 0) goto LAB_0026d1f3;
  }
  toDelete = XMLString::replicate(this->fPath,this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&basePathName,toDelete,this->fMemoryManager);
  uVar5 = XMLString::stringLen(toDelete);
  iVar1 = XMLString::indexOf(toDelete,L'%',0,this->fMemoryManager);
  while( true ) {
    if (iVar1 == -1) {
      this_00 = (BinFileInputStream *)XMemory::operator_new(0x18,this->fMemoryManager);
      BinFileInputStream::BinFileInputStream(this_00,toDelete,this->fMemoryManager);
      if (this_00->fSource == (FileHandle)0x0) {
        (*(this_00->super_BinInputStream)._vptr_BinInputStream[1])(this_00);
        this_00 = (BinFileInputStream *)0x0;
      }
      ArrayJanitor<char16_t>::~ArrayJanitor(&basePathName);
      return &this_00->super_BinInputStream;
    }
    lVar7 = (long)iVar1;
    if ((int)uVar5 <= iVar1 + 2) break;
    toXlat = toDelete[lVar7 + 1];
    if (((9 < (ushort)(toXlat + L'￐')) &&
        ((0x25 < (ushort)toXlat - 0x41 ||
         ((0x3f0000003fU >> ((ulong)((ushort)toXlat - 0x41) & 0x3f) & 1) == 0)))) ||
       ((toXlat_00 = toDelete[iVar1 + 2], 9 < (ushort)(toXlat_00 + L'￐') &&
        ((0x25 < (ushort)toXlat_00 - 0x41 ||
         ((0x3f0000003fU >> ((ulong)((ushort)toXlat_00 - 0x41) & 0x3f) & 1) == 0)))))) {
      value1[2] = toDelete[lVar7 + 2];
      value1[0] = (XMLCh)*(undefined4 *)(toDelete + lVar7);
      value1[1] = (XMLCh)((uint)*(undefined4 *)(toDelete + lVar7) >> 0x10);
      value1[3] = L'\0';
      pMVar6 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x27c,XMLNUM_URI_Component_Invalid_EscapeSequence,toDelete,value1,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      __cxa_throw(pMVar6,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    uVar2 = xlatHexDigit(toXlat);
    uVar3 = xlatHexDigit(toXlat_00);
    toDelete[lVar7] = (short)uVar3 + (short)(uVar2 << 4);
    uVar8 = uVar5 - 2;
    fromIndex = lVar7 + 1;
    for (uVar5 = fromIndex; uVar5 < uVar8; uVar5 = uVar5 + 1) {
      toDelete[uVar5] = toDelete[uVar5 + 2];
    }
    toDelete[uVar5] = L'\0';
    iVar1 = -1;
    if (fromIndex < uVar5) {
      iVar1 = XMLString::indexOf(toDelete,L'%',fromIndex,this->fMemoryManager);
    }
  }
  value1[1] = L'\0';
  value1[2] = L'\0';
  memmove(value1,toDelete + lVar7,(ulong)(iVar1 + 1 < (int)uVar5) * 2 + 2);
  pMVar6 = (MalformedURLException *)__cxa_allocate_exception(0x30);
  MalformedURLException::MalformedURLException
            (pMVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
             ,0x271,XMLNUM_URI_Component_Invalid_EscapeSequence,toDelete,value1,(XMLCh *)0x0,
             (XMLCh *)0x0,this->fMemoryManager);
  __cxa_throw(pMVar6,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

BinInputStream* XMLURL::makeNewStream() const
{
    //
    //  If its a local host, then we short circuit it and use our own file
    //  stream support. Otherwise, we just let it fall through and let the
    //  installed network access object provide a stream.
    //
    if (fProtocol == XMLURL::File)
    {
        if (!fHost || !XMLString::compareIStringASCII(fHost, XMLUni::fgLocalHostString))
        {

            XMLCh* realPath = XMLString::replicate(fPath, fMemoryManager);
            ArrayJanitor<XMLCh> basePathName(realPath, fMemoryManager);

            //
            // Need to manually replace any character reference %xx first
            // HTTP protocol will be done automatically by the netaccessor
            //
            XMLSize_t end = XMLString::stringLen(realPath);
            int percentIndex = XMLString::indexOf(realPath, chPercent, 0, fMemoryManager);

            while (percentIndex != -1) {

            	// Isolate the length/boundary check so we don't try and copy off the end.
                if (percentIndex+2 >= (int)end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
					XMLString::moveChars(value1, &(realPath[percentIndex]), (percentIndex + 1 >= (int)end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }
                else if (!isHexDigit(realPath[percentIndex+1]) || !isHexDigit(realPath[percentIndex+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(realPath[percentIndex]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }

                unsigned int value = (xlatHexDigit(realPath[percentIndex+1]) * 16) + xlatHexDigit(realPath[percentIndex+2]);

                realPath[percentIndex] = XMLCh(value);

                XMLSize_t i =0;
                for (i = percentIndex + 1; i < end - 2 ; i++)
                    realPath[i] = realPath[i+2];
                realPath[i] = chNull;
                end = i;

                if (((XMLSize_t)(percentIndex + 1)) < end)
                  percentIndex = XMLString::indexOf(realPath, chPercent, percentIndex + 1, fMemoryManager);
                else
                  percentIndex = -1;
            }


            BinFileInputStream* retStrm = new (fMemoryManager) BinFileInputStream(realPath, fMemoryManager);
            if (!retStrm->getIsOpen())
            {
                delete retStrm;
                return 0;
            }
            return retStrm;
        }
    }

    //
    //  If we don't have have an installed net accessor object, then we
    //  have to just throw here.
    //
    if (!XMLPlatformUtils::fgNetAccessor)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_UnsupportedProto, fMemoryManager);

    // Else ask the net accessor to create the stream
    return XMLPlatformUtils::fgNetAccessor->makeNew(*this);
}